

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O3

int Parser_isNameChar(int c,int bNameChar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 0;
  iVar3 = 0xce;
  do {
    iVar2 = (iVar1 + iVar3) / 2;
    if (c < (int)(uint)Letter[iVar2].l) {
      iVar3 = iVar2 + -1;
    }
    else {
      if ((uint)c <= (uint)Letter[iVar2].h) {
        return 1;
      }
      iVar1 = iVar2 + 1;
    }
  } while (iVar1 <= iVar3);
  if (bNameChar != 0) {
    iVar1 = 0;
    iVar3 = 0x7a;
    do {
      iVar2 = (iVar1 + iVar3) / 2;
      if (c < (int)(uint)NameChar[iVar2].l) {
        iVar3 = iVar2 + -1;
      }
      else {
        if ((uint)c <= (uint)NameChar[iVar2].h) {
          return 1;
        }
        iVar1 = iVar2 + 1;
      }
    } while (iVar1 <= iVar3);
  }
  return 0;
}

Assistant:

static int Parser_isNameChar(
	/*! [in] The character to check. */
	int c,
	/*! [in] 1 if you also want to check in the NameChar table. */
	int bNameChar)
{
	if (Parser_isCharInTable(c, Letter, (int)LETTERTABLESIZE)) {
		return 1;
	}

	if (bNameChar &&
		Parser_isCharInTable(c, NameChar, (int)NAMECHARTABLESIZE)) {
		return 1;
	}

	return 0;
}